

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O0

_Bool aux_monster(chunk_conflict1 *c,player *p,target_aux_state *auxst)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var4;
  bool bVar5;
  square_conflict *psVar6;
  monster *mon_00;
  monster_lore *lore_00;
  ui_event uVar7;
  target_aux_state *in_stack_fffffffffffffcd0;
  undefined4 uVar8;
  undefined4 local_2c0;
  char local_2a8 [8];
  char o_name [80];
  object *local_250;
  object *obj;
  char *lphrase2;
  char *lphrase1;
  undefined4 local_230;
  char local_218 [8];
  char buf [80];
  undefined4 local_1c0;
  char local_1a8 [7];
  _Bool recall;
  char out_val [256];
  char m_name [80];
  monster_lore *lore;
  monster *mon;
  target_aux_state *auxst_local;
  player *p_local;
  chunk_conflict1 *c_local;
  
  grid.x = (auxst->grid).x;
  grid.y = (auxst->grid).y;
  psVar6 = square((chunk *)c,grid);
  if (0 < psVar6->mon) {
    grid_00.x = (auxst->grid).x;
    grid_00.y = (auxst->grid).y;
    mon_00 = square_monster((chunk *)c,grid_00);
    _Var4 = monster_is_obvious(mon_00);
    if (_Var4) {
      lore_00 = (monster_lore *)get_lore(mon_00->race);
      auxst->boring = false;
      monster_desc(out_val + 0xf8,0x50,mon_00,L'\b');
      monster_race_track(p->upkeep,mon_00->race);
      health_track(p->upkeep,mon_00);
      handle_stuff(p);
      bVar5 = false;
      while( true ) {
        if (bVar5) {
          lore_show_interactive(mon_00->race,lore_00);
          uVar7 = inkey_m();
          buf._72_8_ = uVar7.mouse;
          local_1c0 = CONCAT31(local_1c0._1_3_,uVar7.key.mods);
          *(undefined8 *)&auxst->press = buf._72_8_;
          *(undefined4 *)((long)&auxst->press + 8) = local_1c0;
        }
        else {
          grid_01.x = (auxst->grid).x;
          grid_01.y = (auxst->grid).y;
          psVar6 = square((chunk *)c,grid_01);
          look_mon_desc(local_218,0x50,(int)psVar6->mon);
          in_stack_fffffffffffffcd0 = auxst;
          if ((p->wizard & 1U) == 0) {
            strnfmt(local_1a8,0x100,"%s%s%s (%s), %s.",auxst->phrase1,auxst->phrase2,out_val + 0xf8,
                    local_218,auxst);
          }
          else {
            strnfmt(local_1a8,0x100,"%s%s%s (%s), %s (%d:%d, noise=%d, scent=%d).",auxst->phrase1,
                    auxst->phrase2,out_val + 0xf8,local_218,auxst,(auxst->grid).y,(auxst->grid).x,
                    (uint)(c->noise).grids[(auxst->grid).y][(auxst->grid).x],
                    (uint)(c->scent).grids[(auxst->grid).y][(auxst->grid).x]);
          }
          prt(local_1a8,L'\0',L'\0');
          move_cursor_relative((auxst->grid).y,(auxst->grid).x);
          uVar7 = inkey_m();
          local_230 = CONCAT31(local_230._1_3_,uVar7.key.mods);
          (auxst->press).mouse = uVar7.mouse;
          *(undefined4 *)((long)&auxst->press + 8) = local_230;
        }
        if ((((((auxst->press).type != EVT_MOUSE) || ((auxst->press).mouse.button != '\x01')) ||
             ((int)((uint)(auxst->press).mouse.x - col_map[Term->sidebar_mode]) /
              (int)(uint)tile_width + Term->offset_x != (auxst->grid).x)) ||
            ((int)((uint)(auxst->press).mouse.y - row_top_map[Term->sidebar_mode]) /
             (int)(uint)tile_height + Term->offset_y != (auxst->grid).y)) &&
           (((auxst->press).type != EVT_KBRD || ((auxst->press).key.code != 0x72)))) break;
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if ((auxst->press).type == EVT_MOUSE) {
        if ((auxst->press).mouse.button == '\x02') {
          return true;
        }
        if (((auxst->press).mouse.button != '\0') && ((auxst->mode & 2U) == 0)) {
          return true;
        }
      }
      else {
        if (((auxst->press).key.code != 0x9c) && ((auxst->press).key.code != 0x20)) {
          return true;
        }
        if (((auxst->press).key.code == 0x20) && ((auxst->mode & 2U) == 0)) {
          return true;
        }
      }
      if ((p->wizard & 1U) != 0) {
        _Var4 = flag_has_dbg(mon_00->race->flags,0xc,4,"mon->race->flags","RF_FEMALE");
        if (_Var4) {
          lphrase2 = "She is ";
        }
        else {
          _Var4 = flag_has_dbg(mon_00->race->flags,0xc,3,"mon->race->flags","RF_MALE");
          if (_Var4) {
            lphrase2 = "He is ";
          }
          else {
            lphrase2 = "It is ";
          }
        }
        obj = (object *)0x2be851;
        for (local_250 = mon_00->held_obj;
            uVar8 = (undefined4)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
            local_250 != (object *)0x0; local_250 = local_250->next) {
          object_desc(local_2a8,0x50,local_250,0x43,p);
          iVar1 = (auxst->grid).y;
          iVar2 = (auxst->grid).x;
          in_stack_fffffffffffffcd0 = (target_aux_state *)CONCAT44(uVar8,iVar1);
          strnfmt(local_1a8,0x100,"%s%s%s, %s (%d:%d, noise=%d, scent=%d).",lphrase2,obj,local_2a8,
                  auxst,in_stack_fffffffffffffcd0,iVar2,(uint)(c->noise).grids[iVar1][iVar2],
                  (uint)(c->scent).grids[iVar1][iVar2]);
          prt(local_1a8,L'\0',L'\0');
          move_cursor_relative((auxst->grid).y,(auxst->grid).x);
          uVar7 = inkey_m();
          local_2c0 = CONCAT31(local_2c0._1_3_,uVar7.key.mods);
          (auxst->press).mouse = uVar7.mouse;
          *(undefined4 *)((long)&auxst->press + 8) = local_2c0;
          if ((auxst->press).type == EVT_MOUSE) {
            if ((auxst->press).mouse.button == '\x02') break;
            if ((auxst->press).mouse.button != '\0') {
              wVar3 = auxst->mode;
joined_r0x00278b32:
              if ((wVar3 & 2U) == 0) break;
            }
          }
          else {
            if (((auxst->press).key.code != 0x9c) && ((auxst->press).key.code != 0x20)) break;
            if ((auxst->press).key.code == 0x20) {
              wVar3 = auxst->mode;
              goto joined_r0x00278b32;
            }
          }
          obj = (object *)anon_var_dwarf_13de94;
        }
        if (local_250 != (object *)0x0) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool aux_monster(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	struct monster *mon;
	const struct monster_lore *lore;
	char m_name[80];
	char out_val[TARGET_OUT_VAL_SIZE];
	bool recall;

	if (square(c, auxst->grid)->mon <= 0) return false;

	mon = square_monster(c, auxst->grid);
	if (!monster_is_obvious(mon)) return false;

	/* Actual visible monsters */
	lore = get_lore(mon->race);

	/* Not boring */
	auxst->boring = false;

	/* Get the monster name ("a kobold") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_IND_VIS);

	/* Track this monster's race and health */
	monster_race_track(p->upkeep, mon->race);
	health_track(p->upkeep, mon);
	handle_stuff(p);

	/* Interact */
	recall = false;
	while (1) {
		/* Recall or target */
		if (recall) {
			lore_show_interactive(mon->race, lore);
			auxst->press = inkey_m();
		} else {
			char buf[80];

			/* Describe the monster */
			look_mon_desc(buf, sizeof(buf),
				square(c, auxst->grid)->mon);

			/* Describe, and prompt for recall */
			if (p->wizard) {
				strnfmt(out_val, sizeof(out_val),
					"%s%s%s (%s), %s (%d:%d, noise=%d, scent=%d).",
					auxst->phrase1,
					auxst->phrase2,
					m_name,
					buf,
					auxst->coord_desc,
					auxst->grid.y,
					auxst->grid.x,
					(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
					(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
			} else {
				strnfmt(out_val, sizeof(out_val),
					"%s%s%s (%s), %s.",
					auxst->phrase1,
					auxst->phrase2,
					m_name,
					buf,
					auxst->coord_desc);
			}

			prt(out_val, 0, 0);

			/* Place cursor */
			move_cursor_relative(auxst->grid.y, auxst->grid.x);

			/* Command */
			auxst->press = inkey_m();
		}

		/* Normal commands */
		if (auxst->press.type == EVT_MOUSE
				&& auxst->press.mouse.button == 1
				&& KEY_GRID_X(auxst->press) == auxst->grid.x
				&& KEY_GRID_Y(auxst->press) == auxst->grid.y) {
			recall = !recall;
		} else if (auxst->press.type == EVT_KBRD
				&& auxst->press.key.code == 'r') {
			recall = !recall;
		} else {
			break;
		}
	}

	if (auxst->press.type == EVT_MOUSE) {
		/* Stop on right click */
		if (auxst->press.mouse.button == 2) return true;

		/* Sometimes stop at "space" key */
		if (auxst->press.mouse.button
				&& !(auxst->mode & (TARGET_LOOK))) return true;
	} else {
		/* Stop on everything but "return"/"space" */
		if (auxst->press.key.code != KC_ENTER
				&& auxst->press.key.code != ' ') return true;

		/* Sometimes stop at "space" key */
		if (auxst->press.key.code == ' '
				&& !(auxst->mode & (TARGET_LOOK))) return true;
	}

	/* Describe carried objects (wizards only) */
	if (p->wizard) {
		const char *lphrase1;
		const char *lphrase2;
		struct object *obj;

		/* Take account of gender */
		if (rf_has(mon->race->flags, RF_FEMALE)) {
			lphrase1 = "She is ";
		} else if (rf_has(mon->race->flags, RF_MALE)) {
			lphrase1 = "He is ";
		} else {
			lphrase1 = "It is ";
		}

		/* Use a verb */
		lphrase2 = "carrying ";

		/* Scan all objects being carried */
		for (obj = mon->held_obj; obj; obj = obj->next) {
			char o_name[80];

			/* Obtain an object description */
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);

			strnfmt(out_val, sizeof(out_val),
				"%s%s%s, %s (%d:%d, noise=%d, scent=%d).",
				lphrase1,
				lphrase2,
				o_name,
				auxst->coord_desc,
				auxst->grid.y,
				auxst->grid.x,
				(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
				(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);

			prt(out_val, 0, 0);
			move_cursor_relative(auxst->grid.y, auxst->grid.x);
			auxst->press = inkey_m();

			if (auxst->press.type == EVT_MOUSE) {
				/* Stop on right click */
				if (auxst->press.mouse.button == 2) break;

				/* Sometimes stop at "space" key */
				if (auxst->press.mouse.button
						&& !(auxst->mode & (TARGET_LOOK)))
					break;
			} else {
				/* Stop on everything but "return"/"space" */
				if (auxst->press.key.code != KC_ENTER
						&& auxst->press.key.code != ' ')
					break;

				/* Sometimes stop at "space" key */
				if (auxst->press.key.code == ' '
						&& !(auxst->mode & (TARGET_LOOK)))
					break;
			}

			/* Change the intro */
			lphrase2 = "also carrying ";
		}

		/* Double break */
		if (obj) return true;
	}

	return false;
}